

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

InternalParseResult * __thiscall
Catch::Clara::Arg::parse
          (InternalParseResult *__return_storage_ptr__,Arg *this,string *param_1,TokenStream *tokens
          )

{
  pointer pTVar1;
  char *pcVar2;
  element_type *peVar3;
  pointer pTVar4;
  pointer pTVar5;
  StringRef *pSVar6;
  ParserResult result;
  Result validationResult;
  long *local_a0 [2];
  long local_90 [2];
  BasicResult<Catch::Clara::ParseResultType> local_80;
  BasicResult<void> local_50;
  
  (*(this->super_ParserRefImpl<Catch::Clara::Arg>).super_ComposableParserImpl<Catch::Clara::Arg>.
    super_ParserBase._vptr_ParserBase[2])(&local_50);
  if (local_50.super_ResultValueBase<void>.super_ResultBase.m_type == Ok) {
    pTVar1 = (tokens->m_tokenBuffer).
             super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pTVar1->type == Argument) {
      pcVar2 = (pTVar1->token).m_start;
      peVar3 = (this->super_ParserRefImpl<Catch::Clara::Arg>).m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      local_a0[0] = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,pcVar2,pcVar2 + (pTVar1->token).m_size);
      (*peVar3->_vptr_BoundRef[4])(&local_80,peVar3,local_a0);
      if (local_a0[0] != local_90) {
        operator_delete(local_a0[0],local_90[0] + 1);
      }
      if (local_80.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase.m_type ==
          Ok) {
        Detail::TokenStream::operator++(tokens);
        pTVar1 = (tokens->m_tokenBuffer).
                 super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pTVar4 = (tokens->m_tokenBuffer).
                 super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pTVar5 = (tokens->m_tokenBuffer).
                 super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        (tokens->m_tokenBuffer).
        super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (tokens->m_tokenBuffer).
        super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (tokens->m_tokenBuffer).
        super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
        super_ResultBase.m_type = Ok;
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
        super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_001b24a8;
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
        m_value.m_type = Matched;
        pSVar6 = (tokens->itEnd)._M_current;
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
        m_value.m_remainingTokens.it._M_current = (tokens->it)._M_current;
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
        m_value.m_remainingTokens.itEnd._M_current = pSVar6;
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
        m_value.m_remainingTokens.m_tokenBuffer.
        super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
        ._M_impl.super__Vector_impl_data._M_start = pTVar4;
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
        m_value.m_remainingTokens.m_tokenBuffer.
        super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
        ._M_impl.super__Vector_impl_data._M_finish = pTVar5;
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
        m_value.m_remainingTokens.m_tokenBuffer.
        super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pTVar1;
        (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
        super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b2450;
        (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
        (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
        (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
      }
      else {
        Detail::BasicResult<Catch::Clara::Detail::ParseState>::
        BasicResult<Catch::Clara::ParseResultType>(__return_storage_ptr__,&local_80);
      }
      local_80.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase.
      _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b2540;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.m_errorMessage._M_dataplus._M_p != &local_80.m_errorMessage.field_2) {
        operator_delete(local_80.m_errorMessage._M_dataplus._M_p,
                        local_80.m_errorMessage.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      pTVar4 = (tokens->m_tokenBuffer).
               super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pTVar5 = (tokens->m_tokenBuffer).
               super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (tokens->m_tokenBuffer).
      super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (tokens->m_tokenBuffer).
      super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (tokens->m_tokenBuffer).
      super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
      super_ResultBase.m_type = Ok;
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_001b24a8;
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
      m_value.m_type = NoMatch;
      pSVar6 = (tokens->itEnd)._M_current;
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
      m_value.m_remainingTokens.it._M_current = (tokens->it)._M_current;
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
      m_value.m_remainingTokens.itEnd._M_current = pSVar6;
      *(pointer *)
       ((long)&(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
               field_0 + 0x18) = pTVar1;
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
      m_value.m_remainingTokens.m_tokenBuffer.
      super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
      _M_impl.super__Vector_impl_data._M_finish = pTVar4;
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).field_0.
      m_value.m_remainingTokens.m_tokenBuffer.
      super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = pTVar5;
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::Detail::ParseState>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b2450;
      (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
      (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
      (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
    }
  }
  else {
    Detail::BasicResult<Catch::Clara::Detail::ParseState>::BasicResult<void>
              (__return_storage_ptr__,&local_50);
  }
  local_50.super_ResultValueBase<void>.super_ResultBase._vptr_ResultBase =
       (_func_int **)&PTR__BasicResult_001b25c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_errorMessage._M_dataplus._M_p != &local_50.m_errorMessage.field_2) {
    operator_delete(local_50.m_errorMessage._M_dataplus._M_p,
                    local_50.m_errorMessage.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Detail::InternalParseResult Arg::parse(std::string const&,
                                               Detail::TokenStream tokens) const {
            auto validationResult = validate();
            if (!validationResult)
                return Detail::InternalParseResult(validationResult);

            auto token = *tokens;
            if (token.type != Detail::TokenType::Argument)
                return Detail::InternalParseResult::ok(Detail::ParseState(
                    ParseResultType::NoMatch, CATCH_MOVE(tokens)));

            assert(!m_ref->isFlag());
            auto valueRef =
                static_cast<Detail::BoundValueRefBase*>(m_ref.get());

            auto result = valueRef->setValue(static_cast<std::string>(token.token));
            if ( !result )
                return Detail::InternalParseResult( result );
            else
                return Detail::InternalParseResult::ok(
                    Detail::ParseState( ParseResultType::Matched,
                                        CATCH_MOVE( ++tokens ) ) );
        }